

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O1

State * __thiscall despot::Adventurer::CreateStartState(Adventurer *this,string type)

{
  uint uVar1;
  int iVar2;
  State *this_00;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = (double)despot::Random::NextDouble();
  uVar1 = this->num_goals_;
  if ((int)uVar1 < 1) {
    uVar3 = 0;
  }
  else {
    dVar5 = 0.0;
    uVar3 = 0;
    do {
      dVar5 = dVar5 + (this->goal_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start[uVar3];
      if (dVar4 <= dVar5) goto LAB_0010a206;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    uVar3 = (ulong)uVar1;
  }
LAB_0010a206:
  this_00 = (State *)operator_new(0x20);
  iVar2 = this->size_;
  despot::State::State(this_00);
  *(undefined ***)this_00 = &PTR__State_00113998;
  *(int *)(this_00 + 0xc) = iVar2 * (int)uVar3;
  return this_00;
}

Assistant:

State* Adventurer::CreateStartState(string type) const {
	double prob = Random::RANDOM.NextDouble();
	int goal = 0;
	double sum = 0;
	for (; goal < num_goals_; goal++) {
		sum += goal_prob_[goal];
		if (sum >= prob)
			break;
	}
	AdventurerState* state = new AdventurerState(goal * size_);
	return state;
}